

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::GdiNv3::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,GdiNv3 *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdNotify *this_01;
  MthdPatch *this_02;
  MthdPmTrigger *this_03;
  MthdDmaNotify *this_04;
  MthdCtxPattern *this_05;
  MthdCtxRop *this_06;
  MthdCtxBeta *this_07;
  MthdCtxSurf *this_08;
  MthdMissing *this_09;
  MthdOperation *this_10;
  MthdSolidFormat *this_11;
  MthdBitmapFormat *this_12;
  MthdSolidColor *pMVar2;
  MthdVtxXy *pMVar3;
  MthdRect *this_13;
  MthdClipXy *pMVar4;
  MthdBitmapColor1 *pMVar5;
  MthdIfcSize *pMVar6;
  MthdBitmapData *pMVar7;
  MthdBitmapColor0 *this_14;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_813;
  undefined1 local_812;
  allocator local_811;
  string local_810 [38];
  undefined1 local_7ea;
  allocator local_7e9;
  string local_7e8 [38];
  undefined1 local_7c2;
  allocator local_7c1;
  string local_7c0 [38];
  undefined1 local_79a;
  allocator local_799;
  string local_798 [38];
  undefined1 local_772;
  allocator local_771;
  string local_770 [38];
  undefined1 local_74a;
  allocator local_749;
  string local_748 [38];
  undefined1 local_722;
  allocator local_721;
  string local_720 [38];
  undefined1 local_6fa;
  allocator local_6f9;
  string local_6f8 [38];
  undefined1 local_6d2;
  allocator local_6d1;
  string local_6d0 [38];
  undefined1 local_6aa;
  allocator local_6a9;
  string local_6a8 [38];
  undefined1 local_682;
  allocator local_681;
  string local_680 [38];
  undefined1 local_65a;
  allocator local_659;
  string local_658 [38];
  undefined1 local_632;
  allocator local_631;
  string local_630 [38];
  undefined1 local_60a;
  allocator local_609;
  string local_608 [38];
  undefined1 local_5e2;
  allocator local_5e1;
  string local_5e0 [38];
  undefined1 local_5ba;
  allocator local_5b9;
  string local_5b8 [38];
  undefined1 local_592;
  allocator local_591;
  string local_590 [38];
  undefined1 local_56a;
  allocator local_569;
  string local_568 [38];
  undefined1 local_542;
  allocator local_541;
  string local_540 [38];
  undefined1 local_51a;
  allocator local_519;
  string local_518 [38];
  undefined1 local_4f2;
  allocator local_4f1;
  string local_4f0 [38];
  undefined1 local_4ca;
  allocator local_4c9;
  string local_4c8 [38];
  undefined1 local_4a2;
  allocator local_4a1;
  string local_4a0 [38];
  undefined1 local_47a;
  allocator local_479;
  string local_478 [38];
  undefined1 local_452;
  allocator local_451;
  string local_450 [38];
  undefined1 local_42a;
  allocator local_429;
  string local_428 [38];
  undefined1 local_402;
  allocator local_401;
  string local_400 [38];
  undefined1 local_3da;
  allocator local_3d9;
  string local_3d8 [38];
  undefined1 local_3b2;
  allocator local_3b1;
  string local_3b0 [38];
  undefined1 local_38a;
  allocator local_389;
  string local_388 [38];
  undefined1 local_362;
  allocator local_361;
  string local_360 [38];
  undefined1 local_33a;
  allocator local_339;
  string local_338 [38];
  undefined1 local_312;
  allocator local_311;
  string local_310 [38];
  undefined1 local_2ea;
  allocator local_2e9;
  string local_2e8 [38];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [38];
  undefined1 local_29a;
  allocator local_299;
  string local_298 [38];
  undefined1 local_272;
  allocator local_271;
  string local_270 [38];
  undefined1 local_24a;
  allocator local_249;
  string local_248 [38];
  undefined1 local_222;
  allocator local_221;
  string local_220 [38];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [38];
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [38];
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [48];
  SingleMthdTest *local_178;
  MthdNotify *local_170;
  MthdPatch *local_168;
  MthdPmTrigger *local_160;
  MthdDmaNotify *local_158;
  MthdCtxPattern *local_150;
  MthdCtxRop *local_148;
  MthdCtxBeta *local_140;
  MthdCtxSurf *local_138;
  MthdMissing *local_130;
  MthdOperation *local_128;
  MthdSolidFormat *local_120;
  MthdBitmapFormat *local_118;
  MthdSolidColor *local_110;
  MthdVtxXy *local_108;
  MthdRect *local_100;
  MthdClipXy *local_f8;
  MthdClipXy *local_f0;
  MthdSolidColor *local_e8;
  MthdVtxXy *local_e0;
  MthdVtxXy *local_d8;
  MthdClipXy *local_d0;
  MthdClipXy *local_c8;
  MthdBitmapColor1 *local_c0;
  MthdIfcSize *local_b8;
  MthdVtxXy *local_b0;
  MthdBitmapData *local_a8;
  MthdClipXy *local_a0;
  MthdClipXy *local_98;
  MthdBitmapColor1 *local_90;
  MthdIfcSize *local_88;
  MthdIfcSize *local_80;
  MthdVtxXy *local_78;
  MthdBitmapData *local_70;
  MthdClipXy *local_68;
  MthdClipXy *local_60;
  MthdBitmapColor0 *local_58;
  MthdBitmapColor1 *local_50;
  MthdIfcSize *local_48;
  MthdIfcSize *local_40;
  MthdVtxXy *local_38;
  MthdBitmapData *local_30;
  iterator local_28;
  size_type local_20;
  GdiNv3 *local_18;
  GdiNv3 *this_local;
  
  local_18 = this;
  this_local = (GdiNv3 *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_1aa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"nop",&local_1a9);
  MthdNop::SingleMthdTest
            ((MthdNop *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1a8,-1,
             (this->super_Class).cls,0x100,1,4);
  local_1aa = 0;
  local_178 = this_00;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_1d2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"notify",&local_1d1);
  MthdNotify::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1d0,0,
             (this->super_Class).cls,0x104,1,4);
  local_1d2 = 0;
  local_170 = this_01;
  this_02 = (MthdPatch *)operator_new(0x25950);
  local_1fa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"patch",&local_1f9);
  MthdPatch::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1f8,-1,
             (this->super_Class).cls,0x10c,1,4);
  local_1fa = 0;
  local_168 = this_02;
  this_03 = (MthdPmTrigger *)operator_new(0x25950);
  local_222 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"pm_trigger",&local_221);
  MthdPmTrigger::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_220,-1,
             (this->super_Class).cls,0x140,1,4);
  local_222 = 0;
  local_160 = this_03;
  this_04 = (MthdDmaNotify *)operator_new(0x25950);
  local_24a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"dma_notify",&local_249);
  MthdDmaNotify::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_248,1,
             (this->super_Class).cls,0x180,1,4);
  local_24a = 0;
  local_158 = this_04;
  this_05 = (MthdCtxPattern *)operator_new(0x25958);
  local_272 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"ctx_pattern",&local_271);
  MthdCtxPattern::MthdCtxPattern
            (this_05,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_270,3,
             (this->super_Class).cls,0x184,false);
  local_272 = 0;
  local_150 = this_05;
  this_06 = (MthdCtxRop *)operator_new(0x25950);
  local_29a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"ctx_rop",&local_299);
  MthdCtxRop::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_298,4,
             (this->super_Class).cls,0x188,1,4);
  local_29a = 0;
  local_148 = this_06;
  this_07 = (MthdCtxBeta *)operator_new(0x25950);
  local_2c2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"ctx_beta",&local_2c1);
  MthdCtxBeta::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2c0,5,
             (this->super_Class).cls,0x18c,1,4);
  local_2c2 = 0;
  local_140 = this_07;
  this_08 = (MthdCtxSurf *)operator_new(0x25958);
  local_2ea = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"ctx_dst",&local_2e9);
  MthdCtxSurf::MthdCtxSurf
            (this_08,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2e8,7,
             (this->super_Class).cls,400,0);
  local_2ea = 0;
  local_138 = this_08;
  this_09 = (MthdMissing *)operator_new(0x25950);
  local_312 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"missing",&local_311);
  MthdMissing::SingleMthdTest
            (this_09,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_310,-1,
             (this->super_Class).cls,0x200,1,4);
  local_312 = 0;
  local_130 = this_09;
  this_10 = (MthdOperation *)operator_new(0x25958);
  local_33a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"operation",&local_339);
  MthdOperation::MthdOperation
            (this_10,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_338,8,
             (this->super_Class).cls,0x2fc,false);
  local_33a = 0;
  local_128 = this_10;
  this_11 = (MthdSolidFormat *)operator_new(0x25958);
  local_362 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"format",&local_361);
  MthdSolidFormat::MthdSolidFormat
            (this_11,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_360,9,
             (this->super_Class).cls,0x300,false);
  local_362 = 0;
  local_120 = this_11;
  this_12 = (MthdBitmapFormat *)operator_new(0x25950);
  local_38a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"bitmap_format",&local_389);
  MthdBitmapFormat::SingleMthdTest
            (this_12,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_388,10,
             (this->super_Class).cls,0x304,1,4);
  local_38a = 0;
  local_118 = this_12;
  pMVar2 = (MthdSolidColor *)operator_new(0x25950);
  local_3b2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"a.color",&local_3b1);
  MthdSolidColor::SingleMthdTest
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3b0,0xb,
             (this->super_Class).cls,0x3fc,1,4);
  local_3b2 = 0;
  local_110 = pMVar2;
  pMVar3 = (MthdVtxXy *)operator_new(0x25958);
  local_3da = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"a.xy",&local_3d9);
  MthdVtxXy::MthdVtxXy
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3d8,0xe,
             (this->super_Class).cls,0x400,0x40,8,0x11);
  local_3da = 0;
  local_108 = pMVar3;
  this_13 = (MthdRect *)operator_new(0x25958);
  local_402 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"a.rect",&local_401);
  MthdRect::MthdRect(this_13,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_400,0xf,
                     (this->super_Class).cls,0x404,0x40,8,0x14);
  local_402 = 0;
  local_100 = this_13;
  pMVar4 = (MthdClipXy *)operator_new(0x25958);
  local_42a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"b.clip_xy_0",&local_429);
  MthdClipXy::MthdClipXy
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_428,0x10,
             (this->super_Class).cls,0x7f4,1,false);
  local_42a = 0;
  local_f8 = pMVar4;
  pMVar4 = (MthdClipXy *)operator_new(0x25958);
  local_452 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"b.clip_xy_1",&local_451);
  MthdClipXy::MthdClipXy
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_450,0x11,
             (this->super_Class).cls,0x7f8,1,true);
  local_452 = 0;
  local_f0 = pMVar4;
  pMVar2 = (MthdSolidColor *)operator_new(0x25950);
  local_47a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"b.color",&local_479);
  MthdSolidColor::SingleMthdTest
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_478,0xb,
             (this->super_Class).cls,0x7fc,1,4);
  local_47a = 0;
  local_e8 = pMVar2;
  pMVar3 = (MthdVtxXy *)operator_new(0x25958);
  local_4a2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"b.0.xy",&local_4a1);
  MthdVtxXy::MthdVtxXy
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_4a0,0x12,
             (this->super_Class).cls,0x800,0x40,8,1);
  local_4a2 = 0;
  local_e0 = pMVar3;
  pMVar3 = (MthdVtxXy *)operator_new(0x25958);
  local_4ca = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"b.1.xy",&local_4c9);
  MthdVtxXy::MthdVtxXy
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_4c8,-1,
             (this->super_Class).cls,0x804,0x40,8,4);
  local_4ca = 0;
  local_d8 = pMVar3;
  pMVar4 = (MthdClipXy *)operator_new(0x25958);
  local_4f2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"c.clip_xy_0",&local_4f1);
  MthdClipXy::MthdClipXy
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_4f0,0x10,
             (this->super_Class).cls,0xbec,1,false);
  local_4f2 = 0;
  local_d0 = pMVar4;
  pMVar4 = (MthdClipXy *)operator_new(0x25958);
  local_51a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"c.clip_xy_1",&local_519);
  MthdClipXy::MthdClipXy
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_518,0x11,
             (this->super_Class).cls,0xbf0,1,true);
  local_51a = 0;
  local_c8 = pMVar4;
  pMVar5 = (MthdBitmapColor1 *)operator_new(0x25950);
  local_542 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"c.color",&local_541);
  MthdBitmapColor1::SingleMthdTest
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_540,0xc,
             (this->super_Class).cls,0xbf4,1,4);
  local_542 = 0;
  local_c0 = pMVar5;
  pMVar6 = (MthdIfcSize *)operator_new(0x25958);
  local_56a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"c.size",&local_569);
  MthdIfcSize::MthdIfcSize
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_568,0x15,
             (this->super_Class).cls,0xbf8,0x16);
  local_56a = 0;
  local_b8 = pMVar6;
  pMVar3 = (MthdVtxXy *)operator_new(0x25958);
  local_592 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"c.xy",&local_591);
  MthdVtxXy::MthdVtxXy
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_590,0x14,
             (this->super_Class).cls,0xbfc,1,4,0x21);
  local_592 = 0;
  local_b0 = pMVar3;
  pMVar7 = (MthdBitmapData *)operator_new(0x25958);
  local_5ba = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"c.bitmap_data",&local_5b9);
  MthdBitmapData::MthdBitmapData
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_5b8,0x18,
             (this->super_Class).cls,0xc00,0x80,4,false);
  local_5ba = 0;
  local_a8 = pMVar7;
  pMVar4 = (MthdClipXy *)operator_new(0x25958);
  local_5e2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"d.clip_xy_0",&local_5e1);
  MthdClipXy::MthdClipXy
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_5e0,0x10,
             (this->super_Class).cls,0xfe8,1,false);
  local_5e2 = 0;
  local_a0 = pMVar4;
  pMVar4 = (MthdClipXy *)operator_new(0x25958);
  local_60a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"d.clip_xy_1",&local_609);
  MthdClipXy::MthdClipXy
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_608,0x11,
             (this->super_Class).cls,0xfec,1,true);
  local_60a = 0;
  local_98 = pMVar4;
  pMVar5 = (MthdBitmapColor1 *)operator_new(0x25950);
  local_632 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"d.color",&local_631);
  MthdBitmapColor1::SingleMthdTest
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_630,0xc,
             (this->super_Class).cls,0xff0,1,4);
  local_632 = 0;
  local_90 = pMVar5;
  pMVar6 = (MthdIfcSize *)operator_new(0x25958);
  local_65a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,"d.size_in",&local_659);
  MthdIfcSize::MthdIfcSize
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_658,0x16,
             (this->super_Class).cls,0xff4,0x12);
  local_65a = 0;
  local_88 = pMVar6;
  pMVar6 = (MthdIfcSize *)operator_new(0x25958);
  local_682 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_680,"d.size_out",&local_681);
  MthdIfcSize::MthdIfcSize
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_680,0x17,
             (this->super_Class).cls,0xff8,0x14);
  local_682 = 0;
  local_80 = pMVar6;
  pMVar3 = (MthdVtxXy *)operator_new(0x25958);
  local_6aa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"d.xy",&local_6a9);
  MthdVtxXy::MthdVtxXy
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_6a8,0x14,
             (this->super_Class).cls,0xffc,1,4,0x21);
  local_6aa = 0;
  local_78 = pMVar3;
  pMVar7 = (MthdBitmapData *)operator_new(0x25958);
  local_6d2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"d.bitmap_data",&local_6d1);
  MthdBitmapData::MthdBitmapData
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_6d0,0x18,
             (this->super_Class).cls,0x1000,0x80,4,false);
  local_6d2 = 0;
  local_70 = pMVar7;
  pMVar4 = (MthdClipXy *)operator_new(0x25958);
  local_6fa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"e.clip_xy_0",&local_6f9);
  MthdClipXy::MthdClipXy
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_6f8,0x10,
             (this->super_Class).cls,0x13e4,1,false);
  local_6fa = 0;
  local_68 = pMVar4;
  pMVar4 = (MthdClipXy *)operator_new(0x25958);
  local_722 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"e.clip_xy_1",&local_721);
  MthdClipXy::MthdClipXy
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_720,0x11,
             (this->super_Class).cls,0x13e8,1,true);
  local_722 = 0;
  local_60 = pMVar4;
  this_14 = (MthdBitmapColor0 *)operator_new(0x25950);
  local_74a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_748,"e.color0",&local_749);
  MthdBitmapColor0::SingleMthdTest
            (this_14,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_748,0xd,
             (this->super_Class).cls,0x13ec,1,4);
  local_74a = 0;
  local_58 = this_14;
  pMVar5 = (MthdBitmapColor1 *)operator_new(0x25950);
  local_772 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"e.color1",&local_771);
  MthdBitmapColor1::SingleMthdTest
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_770,0xc,
             (this->super_Class).cls,0x13f0,1,4);
  local_772 = 0;
  local_50 = pMVar5;
  pMVar6 = (MthdIfcSize *)operator_new(0x25958);
  local_79a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"e.size_in",&local_799);
  MthdIfcSize::MthdIfcSize
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_798,0x16,
             (this->super_Class).cls,0x13f4,0x12);
  local_79a = 0;
  local_48 = pMVar6;
  pMVar6 = (MthdIfcSize *)operator_new(0x25958);
  local_7c2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"e.size_out",&local_7c1);
  MthdIfcSize::MthdIfcSize
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_7c0,0x17,
             (this->super_Class).cls,0x13f8,0x14);
  local_7c2 = 0;
  local_40 = pMVar6;
  pMVar3 = (MthdVtxXy *)operator_new(0x25958);
  local_7ea = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e8,"e.xy",&local_7e9);
  MthdVtxXy::MthdVtxXy
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_7e8,0x14,
             (this->super_Class).cls,0x13fc,1,4,0x21);
  local_7ea = 0;
  local_38 = pMVar3;
  pMVar7 = (MthdBitmapData *)operator_new(0x25958);
  local_812 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"e.bitmap_data",&local_811);
  MthdBitmapData::MthdBitmapData
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_810,0x19,
             (this->super_Class).cls,0x1400,0x80,4,true);
  local_812 = 0;
  local_28 = &local_178;
  local_20 = 0x2a;
  local_30 = pMVar7;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_813);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_813);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_813);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> GdiNv3::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x184, false),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x188),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x18c),
		new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x190, 0),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, false),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, false),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 10, cls, 0x304),
		new MthdSolidColor(opt, rnd(), "a.color", 11, cls, 0x3fc),
		new MthdVtxXy(opt, rnd(), "a.xy", 14, cls, 0x400, 0x40, 8, VTX_FIRST | VTX_NOCLIP),
		new MthdRect(opt, rnd(), "a.rect", 15, cls, 0x404, 0x40, 8, VTX_DRAW | VTX_NOCLIP),
		new MthdClipXy(opt, rnd(), "b.clip_xy_0", 16, cls, 0x7f4, 1, 0),
		new MthdClipXy(opt, rnd(), "b.clip_xy_1", 17, cls, 0x7f8, 1, 1),
		new MthdSolidColor(opt, rnd(), "b.color", 11, cls, 0x7fc),
		new MthdVtxXy(opt, rnd(), "b.0.xy", 18, cls, 0x800, 0x40, 8, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "b.1.xy", -1, cls, 0x804, 0x40, 8, VTX_DRAW),
		new MthdClipXy(opt, rnd(), "c.clip_xy_0", 16, cls, 0xbec, 1, 0),
		new MthdClipXy(opt, rnd(), "c.clip_xy_1", 17, cls, 0xbf0, 1, 1),
		new MthdBitmapColor1(opt, rnd(), "c.color", 12, cls, 0xbf4),
		new MthdIfcSize(opt, rnd(), "c.size", 21, cls, 0xbf8, IFC_IN | IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "c.xy", 20, cls, 0xbfc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "c.bitmap_data", 24, cls, 0xc00, 0x80, 4, false),
		new MthdClipXy(opt, rnd(), "d.clip_xy_0", 16, cls, 0xfe8, 1, 0),
		new MthdClipXy(opt, rnd(), "d.clip_xy_1", 17, cls, 0xfec, 1, 1),
		new MthdBitmapColor1(opt, rnd(), "d.color", 12, cls, 0xff0),
		new MthdIfcSize(opt, rnd(), "d.size_in", 22, cls, 0xff4, IFC_IN | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "d.size_out", 23, cls, 0xff8, IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "d.xy", 20, cls, 0xffc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "d.bitmap_data", 24, cls, 0x1000, 0x80, 4, false),
		new MthdClipXy(opt, rnd(), "e.clip_xy_0", 16, cls, 0x13e4, 1, 0),
		new MthdClipXy(opt, rnd(), "e.clip_xy_1", 17, cls, 0x13e8, 1, 1),
		new MthdBitmapColor0(opt, rnd(), "e.color0", 13, cls, 0x13ec),
		new MthdBitmapColor1(opt, rnd(), "e.color1", 12, cls, 0x13f0),
		new MthdIfcSize(opt, rnd(), "e.size_in", 22, cls, 0x13f4, IFC_IN | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "e.size_out", 23, cls, 0x13f8, IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "e.xy", 20, cls, 0x13fc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "e.bitmap_data", 25, cls, 0x1400, 0x80, 4, true),
	};
}